

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].field_0x40 = 0x8387a8;
  *(undefined8 *)&this->field_0x28 = 0x838820;
  *(undefined8 *)&this[-1].field_0xc8 = 0x8387d0;
  *(undefined8 *)this = 0x8387f8;
  pvVar2 = *(void **)&this->field_0x10;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this->field_0x20 - (long)pvVar2);
  }
  *(undefined8 *)&this[-1].field_0x40 = 0x838938;
  *(undefined8 *)&this->field_0x28 = 0x838960;
  puVar3 = (undefined1 *)
           this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.aux_is_derived.
           super__Base_bitset<1UL>._M_w;
  puVar1 = &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.field_0x18;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x78 != &this[-1].field_0x88) {
    operator_delete(*(undefined1 **)&this[-1].field_0x78,*(long *)&this[-1].field_0x88 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x50 != &this[-1].field_0x60) {
    operator_delete(*(undefined1 **)&this[-1].field_0x50,*(long *)&this[-1].field_0x60 + 1);
  }
  operator_delete(&this[-1].field_0x40,0xd8);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}